

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.hpp
# Opt level: O0

object * __thiscall
msgpack::v1::adaptor::
convert<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
::operator()(convert<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
             *this,object *o,
            tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *v)

{
  type_error *this_00;
  object *in_RSI;
  tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffd8;
  object *in_stack_ffffffffffffffe0;
  
  if ((in_RSI->super_object).type != ARRAY) {
    this_00 = (type_error *)__cxa_allocate_exception(8);
    memset(this_00,0,8);
    type_error::type_error(this_00);
    __cxa_throw(this_00,&type_error::typeinfo,type_error::~type_error);
  }
  StdTupleConverter<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_2UL>
  ::convert(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return in_RSI;
}

Assistant:

msgpack::object const& operator()(
        msgpack::object const& o,
        std::tuple<Args...>& v) const {
        if(o.type != msgpack::type::ARRAY) { throw msgpack::type_error(); }
        StdTupleConverter<decltype(v), sizeof...(Args)>::convert(o, v);
        return o;
    }